

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86.cpp
# Opt level: O2

int __thiscall ncnn::Swish_x86::forward_inplace(Swish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar14 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pfVar6 = (float *)(sVar4 * uVar11 * sVar3 + (long)pvVar2);
    lVar9 = 0;
    for (iVar8 = 0; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      fVar1 = pfVar6[2];
      fVar12 = pfVar6[3];
      auVar22._0_8_ = *(ulong *)pfVar6 ^ 0x8000000080000000;
      auVar22._8_4_ = -fVar1;
      auVar22._12_4_ = -fVar12;
      auVar23 = minps(auVar22,_DAT_004c5fd0);
      auVar23 = maxps(auVar23,_DAT_004c5fe0);
      fVar13 = auVar23._0_4_ * 1.442695 + 0.5;
      fVar15 = auVar23._4_4_ * 1.442695 + 0.5;
      fVar16 = auVar23._8_4_ * 1.442695 + 0.5;
      fVar17 = auVar23._12_4_ * 1.442695 + 0.5;
      fVar18 = (float)(int)fVar13;
      fVar19 = (float)(int)fVar15;
      fVar20 = (float)(int)fVar16;
      fVar21 = (float)(int)fVar17;
      fVar18 = fVar18 - (float)(-(uint)(fVar13 < fVar18) & 0x3f800000);
      fVar19 = fVar19 - (float)(-(uint)(fVar15 < fVar19) & 0x3f800000);
      fVar20 = fVar20 - (float)(-(uint)(fVar16 < fVar20) & 0x3f800000);
      fVar21 = fVar21 - (float)(-(uint)(fVar17 < fVar21) & 0x3f800000);
      fVar13 = fVar18 * -0.6931472 + auVar23._0_4_;
      fVar15 = fVar19 * -0.6931472 + auVar23._4_4_;
      fVar16 = fVar20 * -0.6931472 + auVar23._8_4_;
      fVar17 = fVar21 * -0.6931472 + auVar23._12_4_;
      auVar14._0_4_ =
           fVar13 + 1.0 +
           (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
             0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5) * fVar13 * fVar13;
      auVar14._4_4_ =
           fVar15 + 1.0 +
           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
             0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15;
      auVar14._8_4_ =
           fVar16 + 1.0 +
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16;
      auVar14._12_4_ =
           fVar17 + 1.0 +
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17;
      fVar13 = (float)((int)fVar18 * 0x800000 + 0x3f800000) * auVar14._0_4_ + 1.0;
      fVar15 = (float)((int)fVar19 * 0x800000 + 0x3f800000) * auVar14._4_4_ + 1.0;
      fVar16 = (float)((int)fVar20 * 0x800000 + 0x3f800000) * auVar14._8_4_ + 1.0;
      fVar17 = (float)((int)fVar21 * 0x800000 + 0x3f800000) * auVar14._12_4_ + 1.0;
      auVar23._4_4_ = fVar15;
      auVar23._0_4_ = fVar13;
      auVar23._8_4_ = fVar16;
      auVar23._12_4_ = fVar17;
      auVar23 = rcpps(auVar14,auVar23);
      fVar18 = *pfVar6 * auVar23._0_4_;
      fVar19 = pfVar6[1] * auVar23._4_4_;
      fVar20 = fVar1 * auVar23._8_4_;
      fVar21 = fVar12 * auVar23._12_4_;
      *pfVar6 = (*pfVar6 - fVar13 * fVar18) * auVar23._0_4_ + fVar18;
      pfVar6[1] = (pfVar6[1] - fVar15 * fVar19) * auVar23._4_4_ + fVar19;
      pfVar6[2] = (fVar1 - fVar16 * fVar20) * auVar23._8_4_ + fVar20;
      pfVar6[3] = (fVar12 - fVar17 * fVar21) * auVar23._12_4_ + fVar21;
      pfVar6 = pfVar6 + 4;
      lVar9 = lVar9 + 4;
    }
    lVar5 = sVar4 * sVar3 * uVar11;
    for (; (int)lVar9 < iVar7; lVar9 = lVar9 + 1) {
      fVar1 = *(float *)((long)pvVar2 + lVar9 * 4 + lVar5);
      fVar12 = expf(-fVar1);
      *(float *)((long)pvVar2 + lVar9 * 4 + lVar5) = fVar1 / (fVar12 + 1.0);
    }
  }
  return 0;
}

Assistant:

int Swish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}